

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

int __thiscall soplex::SVectorBase<double>::remove(SVectorBase<double> *this,char *__filename)

{
  Nonzero<double> *pNVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  int newsize;
  
  iVar2 = size(this);
  iVar2 = iVar2 + -1;
  set_size(this,iVar2);
  pNVar3 = (Nonzero<double> *)((ulong)__filename & 0xffffffff);
  if ((int)__filename < iVar2) {
    pNVar1 = this->m_elem;
    pNVar3 = this->m_elem + (int)__filename;
    pNVar3->val = pNVar1[iVar2].val;
    pNVar3->idx = pNVar1[iVar2].idx;
  }
  return (int)pNVar3;
}

Assistant:

void remove(int n)
   {
      assert(n >= 0);
      assert(n < size());

      int newsize = size() - 1;
      set_size(newsize);

      if(n < newsize)
         m_elem[n] = m_elem[newsize];
   }